

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdirlisting.cpp
# Opt level: O2

const_iterator __thiscall QDirListing::begin(QDirListing *this)

{
  const_iterator cVar1;
  
  QDirListingPrivate::beginIterating(this->d);
  cVar1.dirEntry.dirListPtr = next(this->d);
  return (const_iterator)cVar1.dirEntry.dirListPtr;
}

Assistant:

QDirListing::const_iterator QDirListing::begin() const
{
    d->beginIterating();
    const_iterator it{d};
    ++it;
    return it;
}